

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::UnaryOP(SQCompiler *this,SQOpcode op)

{
  SQInteger arg1;
  undefined4 in_ESI;
  long in_RDI;
  SQFuncState *unaff_retaddr;
  SQInteger src;
  SQCompiler *in_stack_00000090;
  SQFuncState *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  long lVar2;
  SQOpcode _op;
  
  lVar2 = in_RDI;
  PrefixedExpr(in_stack_00000090);
  _op = (SQOpcode)((ulong)lVar2 >> 0x20);
  arg1 = SQFuncState::PopTarget
                   ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  this_00 = *(SQFuncState **)(in_RDI + 8);
  uVar1 = in_ESI;
  SQFuncState::PushTarget(this_00,in_RDI);
  SQFuncState::AddInstruction
            (unaff_retaddr,_op,CONCAT44(uVar1,in_stack_fffffffffffffff0),arg1,
             CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(SQInteger)this_00);
  return;
}

Assistant:

void UnaryOP(SQOpcode op)
    {
        PrefixedExpr();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), src);
    }